

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

char * Curl_concat_url(char *base,char *relurl)

{
  char cVar1;
  char *sep;
  char *__haystack;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  size_t __n;
  _Bool relative;
  char *pcVar5;
  char *__s;
  char cVar6;
  int iVar7;
  
  __haystack = (*Curl_cstrdup)(base);
  if (__haystack == (char *)0x0) {
    return (char *)0x0;
  }
  pcVar2 = strstr(__haystack,"//");
  __s = pcVar2 + 2;
  if (pcVar2 == (char *)0x0) {
    __s = __haystack;
  }
  cVar1 = *relurl;
  if (cVar1 == '/') {
    if (relurl[1] == '/') {
      *__s = '\0';
      relurl = relurl + 2;
      relative = false;
    }
    else {
      pcVar2 = strchr(__s,0x2f);
      pcVar3 = strchr(__s,0x3f);
      if (pcVar2 != (char *)0x0) {
        pcVar5 = pcVar2;
        if (pcVar3 < pcVar2) {
          pcVar5 = pcVar3;
        }
        if (pcVar3 == (char *)0x0) {
          pcVar5 = pcVar2;
        }
        *pcVar5 = '\0';
        goto LAB_003acf49;
      }
      relative = true;
      if (pcVar3 != (char *)0x0) {
        *pcVar3 = '\0';
      }
    }
  }
  else {
    pcVar2 = strchr(__s,0x3f);
    if (pcVar2 != (char *)0x0) {
      *pcVar2 = '\0';
      cVar1 = *relurl;
    }
    cVar6 = '?';
    if ((cVar1 != '?') && (pcVar2 = strrchr(__s,0x2f), cVar6 = cVar1, pcVar2 != (char *)0x0)) {
      *pcVar2 = '\0';
      cVar6 = *relurl;
    }
    pcVar2 = strchr(__s,0x2f);
    __s = pcVar2 + 1;
    if (pcVar2 == (char *)0x0) {
      __s = (char *)0x0;
    }
    if (cVar6 == '.') {
      relurl = relurl + (ulong)(relurl[1] == '/') * 2;
    }
    iVar7 = 0;
    for (; ((*relurl == '.' && (relurl[1] == '.')) && (relurl[2] == '/')); relurl = relurl + 3) {
      iVar7 = iVar7 + -1;
    }
    relative = true;
    if (pcVar2 == (char *)0x0) {
      __s = (char *)0x0;
    }
    else {
      for (; iVar7 != 0; iVar7 = iVar7 + 1) {
        pcVar3 = strrchr(__s,0x2f);
        if (pcVar3 == (char *)0x0) {
          *__s = '\0';
          __s = pcVar2 + 1;
          break;
        }
        *pcVar3 = '\0';
      }
LAB_003acf49:
      relative = true;
    }
  }
  sVar4 = Curl_strlen_url(relurl,relative);
  __n = strlen(__haystack);
  pcVar2 = (char *)(*Curl_cmalloc)(sVar4 + __n + 2);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
    goto LAB_003acfc0;
  }
  memcpy(pcVar2,__haystack,__n);
  cVar1 = *relurl;
  if (cVar1 != '/') {
    if (__s == (char *)0x0) {
      if (cVar1 != '?') goto LAB_003acfa3;
    }
    else if ((cVar1 != '?') && (*__s != '\0')) {
LAB_003acfa3:
      pcVar2[__n] = '/';
      __n = __n + 1;
    }
  }
  Curl_strcpy_url(pcVar2 + __n,relurl,relative);
LAB_003acfc0:
  (*Curl_cfree)(__haystack);
  return pcVar2;
}

Assistant:

char *Curl_concat_url(const char *base, const char *relurl)
{
  /***
   TRY to append this new path to the old URL
   to the right of the host part. Oh crap, this is doomed to cause
   problems in the future...
  */
  char *newest;
  char *protsep;
  char *pathsep;
  size_t newlen;
  bool host_changed = FALSE;

  const char *useurl = relurl;
  size_t urllen;

  /* we must make our own copy of the URL to play with, as it may
     point to read-only data */
  char *url_clone = strdup(base);

  if(!url_clone)
    return NULL; /* skip out of this NOW */

  /* protsep points to the start of the host name */
  protsep = strstr(url_clone, "//");
  if(!protsep)
    protsep = url_clone;
  else
    protsep += 2; /* pass the slashes */

  if('/' != relurl[0]) {
    int level = 0;

    /* First we need to find out if there's a ?-letter in the URL,
       and cut it and the right-side of that off */
    pathsep = strchr(protsep, '?');
    if(pathsep)
      *pathsep = 0;

    /* we have a relative path to append to the last slash if there's one
       available, or if the new URL is just a query string (starts with a
       '?')  we append the new one at the end of the entire currently worked
       out URL */
    if(useurl[0] != '?') {
      pathsep = strrchr(protsep, '/');
      if(pathsep)
        *pathsep = 0;
    }

    /* Check if there's any slash after the host name, and if so, remember
       that position instead */
    pathsep = strchr(protsep, '/');
    if(pathsep)
      protsep = pathsep + 1;
    else
      protsep = NULL;

    /* now deal with one "./" or any amount of "../" in the newurl
       and act accordingly */

    if((useurl[0] == '.') && (useurl[1] == '/'))
      useurl += 2; /* just skip the "./" */

    while((useurl[0] == '.') &&
          (useurl[1] == '.') &&
          (useurl[2] == '/')) {
      level++;
      useurl += 3; /* pass the "../" */
    }

    if(protsep) {
      while(level--) {
        /* cut off one more level from the right of the original URL */
        pathsep = strrchr(protsep, '/');
        if(pathsep)
          *pathsep = 0;
        else {
          *protsep = 0;
          break;
        }
      }
    }
  }
  else {
    /* We got a new absolute path for this server */

    if((relurl[0] == '/') && (relurl[1] == '/')) {
      /* the new URL starts with //, just keep the protocol part from the
         original one */
      *protsep = 0;
      useurl = &relurl[2]; /* we keep the slashes from the original, so we
                              skip the new ones */
      host_changed = TRUE;
    }
    else {
      /* cut off the original URL from the first slash, or deal with URLs
         without slash */
      pathsep = strchr(protsep, '/');
      if(pathsep) {
        /* When people use badly formatted URLs, such as
           "http://www.url.com?dir=/home/daniel" we must not use the first
           slash, if there's a ?-letter before it! */
        char *sep = strchr(protsep, '?');
        if(sep && (sep < pathsep))
          pathsep = sep;
        *pathsep = 0;
      }
      else {
        /* There was no slash. Now, since we might be operating on a badly
           formatted URL, such as "http://www.url.com?id=2380" which doesn't
           use a slash separator as it is supposed to, we need to check for a
           ?-letter as well! */
        pathsep = strchr(protsep, '?');
        if(pathsep)
          *pathsep = 0;
      }
    }
  }

  /* If the new part contains a space, this is a mighty stupid redirect
     but we still make an effort to do "right". To the left of a '?'
     letter we replace each space with %20 while it is replaced with '+'
     on the right side of the '?' letter.
  */
  newlen = Curl_strlen_url(useurl, !host_changed);

  urllen = strlen(url_clone);

  newest = malloc(urllen + 1 + /* possible slash */
                  newlen + 1 /* zero byte */);

  if(!newest) {
    free(url_clone); /* don't leak this */
    return NULL;
  }

  /* copy over the root url part */
  memcpy(newest, url_clone, urllen);

  /* check if we need to append a slash */
  if(('/' == useurl[0]) || (protsep && !*protsep) || ('?' == useurl[0]))
    ;
  else
    newest[urllen++]='/';

  /* then append the new piece on the right side */
  Curl_strcpy_url(&newest[urllen], useurl, !host_changed);

  free(url_clone);

  return newest;
}